

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O2

void (anonymous_namespace)::buildCommand((anonymous_namespace)::BuildContext&,llbuild::ninja::
     Command*)::NinjaCommandTask::writeDescription((anonymous_namespace)::BuildContext&,llbuild::
     ninja::Command__(BuildContext *context,Command *command)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  size_type sVar3;
  type tVar4;
  long lVar5;
  int iVar6;
  char *__format;
  int iVar7;
  uint __val;
  char cVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  double dVar11;
  string *psStack_b0;
  uint8_t result;
  long local_a0;
  char buf [64];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (context->verbose == false) {
    local_a0 = (ulong)((command->description)._M_string_length != 0) * 0x20 + 0x70;
  }
  else {
    local_a0 = 0x70;
  }
  context->numOutputDescriptions = context->numOutputDescriptions + 1;
  puVar9 = (uint8_t *)(context->statusLinePrefixFormat)._M_dataplus._M_p;
  sVar3 = (context->statusLinePrefixFormat)._M_string_length;
  local_50 = local_40;
  local_48 = 0;
  puVar1 = puVar9 + sVar3;
  local_40[0] = 0;
  psStack_b0 = (string *)(sVar3 << 2);
  std::__cxx11::string::reserve((ulong)&local_50);
  do {
    if (puVar9 == puVar1) {
LAB_0012699e:
      anon_unknown.dwarf_988a7::BuildContext::emitStatus
                (context,(char *)psStack_b0,local_50,
                 *(undefined8 *)
                  ((long)&(command->super_JobDescriptor)._vptr_JobDescriptor + local_a0));
      std::__cxx11::string::_M_dispose();
      if (command->executionPool ==
          ((context->manifest)._M_t.
           super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
           .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl)->consolePool) {
        llbuild::commands::CommandLineStatusOutput::finishLine(&context->statusOutput);
      }
      return;
    }
    uVar2 = *puVar9;
    psStack_b0 = (string *)(ulong)(uint)(int)(char)uVar2;
    cVar8 = (char)(string *)&local_50;
    if (uVar2 == '\\') {
      puVar10 = puVar9 + 1;
      if (puVar10 != puVar1) {
        uVar2 = *puVar10;
        switch(uVar2) {
        case '\\':
          psStack_b0 = (string *)0x5c;
          break;
        case ']':
        case '^':
        case '_':
        case '`':
        case 'c':
        case 'd':
switchD_001266a4_caseD_6f:
          std::__cxx11::string::push_back(cVar8);
LAB_0012698f:
          psStack_b0 = (string *)(ulong)(uint)(int)(char)uVar2;
          break;
        case 'a':
          psStack_b0 = (string *)0x7;
          break;
        case 'b':
          psStack_b0 = (string *)0x8;
          break;
        case 'e':
          psStack_b0 = (string *)0x1b;
          break;
        case 'f':
          psStack_b0 = (string *)0xc;
          break;
        default:
          switch(uVar2) {
          case 'n':
            psStack_b0 = (string *)0xa;
            break;
          case 'o':
          case 'p':
          case 'q':
          case 's':
          case 'u':
          case 'w':
            goto switchD_001266a4_caseD_6f;
          case 'r':
            psStack_b0 = (string *)0xd;
            break;
          case 't':
            psStack_b0 = (string *)0x9;
            break;
          case 'v':
            psStack_b0 = (string *)0xb;
            break;
          case 'x':
            result = '\0';
            if ((long)puVar1 - (long)puVar10 < 3) {
LAB_00126911:
              std::__cxx11::string::push_back(cVar8);
              psStack_b0 = (string *)0x78;
              break;
            }
            buf._0_8_ = puVar9 + 2;
            buf[8] = '\x02';
            buf[9] = '\0';
            buf[10] = '\0';
            buf[0xb] = '\0';
            buf[0xc] = '\0';
            buf[0xd] = '\0';
            buf[0xe] = '\0';
            buf[0xf] = '\0';
            tVar4 = llvm::StringRef::getAsInteger<unsigned_char>((StringRef *)buf,0x10,&result);
            if (tVar4) goto LAB_00126911;
            psStack_b0 = (string *)(ulong)(uint)(int)(char)result;
            std::__cxx11::string::push_back(cVar8);
            puVar10 = puVar9 + 3;
            goto LAB_00126927;
          default:
            if (uVar2 != '0') goto switchD_001266a4_caseD_6f;
            result = '\0';
            if ((long)puVar1 - (long)puVar10 < 4) {
              if ((long)puVar1 - (long)puVar10 == 3) goto LAB_00126938;
LAB_0012695c:
              std::__cxx11::string::push_back(cVar8);
              uVar2 = '0';
            }
            else {
              buf._0_8_ = puVar9 + 2;
              buf[8] = '\x03';
              buf[9] = '\0';
              buf[10] = '\0';
              buf[0xb] = '\0';
              buf[0xc] = '\0';
              buf[0xd] = '\0';
              buf[0xe] = '\0';
              buf[0xf] = '\0';
              tVar4 = llvm::StringRef::getAsInteger<unsigned_char>((StringRef *)buf,8,&result);
              if (tVar4) {
LAB_00126938:
                buf[8] = '\x03';
                buf[9] = '\0';
                buf[10] = '\0';
                buf[0xb] = '\0';
                buf[0xc] = '\0';
                buf[0xd] = '\0';
                buf[0xe] = '\0';
                buf[0xf] = '\0';
                buf._0_8_ = puVar10;
                tVar4 = llvm::StringRef::getAsInteger<unsigned_char>((StringRef *)buf,8,&result);
                if (tVar4) goto LAB_0012695c;
                puVar10 = puVar9 + 3;
                uVar2 = result;
              }
              else {
                puVar10 = puVar9 + 4;
                uVar2 = result;
              }
            }
            goto LAB_0012698f;
          }
        }
        std::__cxx11::string::push_back(cVar8);
        goto LAB_00126927;
      }
LAB_00126994:
      std::__cxx11::string::push_back((char)&local_50);
      goto LAB_0012699e;
    }
    puVar10 = puVar9;
    if (uVar2 != '%') goto LAB_00126781;
    puVar10 = puVar9 + 1;
    if (puVar10 == puVar1) goto LAB_00126994;
    uVar2 = *puVar10;
    switch(uVar2) {
    case 'c':
    case 'o':
      lVar5 = std::chrono::_V2::steady_clock::now();
      dVar11 = ((double)context->numOutputDescriptions * 1000.0) /
               (double)((lVar5 - (context->buildStartTime).__d.__r) / 1000000);
      __format = "%.1f";
      goto LAB_0012684d;
    case 'd':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'q':
      goto switchD_00126660_caseD_64;
    case 'e':
      lVar5 = std::chrono::_V2::steady_clock::now();
      dVar11 = (double)((lVar5 - (context->buildStartTime).__d.__r) / 1000000) / 1000.0;
      __format = "%.3f";
LAB_0012684d:
      snprintf(buf,0x40,__format,dVar11);
LAB_00126854:
      psStack_b0 = (string *)buf;
      std::__cxx11::string::append((char *)&local_50);
      goto LAB_00126927;
    case 'f':
      __val = context->numOutputDescriptions;
      break;
    case 'p':
      snprintf(buf,0x40,"%3ld%%",
               (ulong)(context->numOutputDescriptions * 100) /
               (ulong)(((context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i +
                       (context->numCommandsCompleted).super___atomic_base<unsigned_int>._M_i) -
                      ((context->numCommandsUpdated).super___atomic_base<unsigned_int>._M_i +
                      (context->numCommandsUpToDate).super___atomic_base<unsigned_int>._M_i)));
      goto LAB_00126854;
    case 'r':
    case 's':
      __val = (context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i;
      break;
    case 't':
      iVar7 = (context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i +
              (context->numCommandsCompleted).super___atomic_base<unsigned_int>._M_i;
      iVar6 = (context->numCommandsUpdated).super___atomic_base<unsigned_int>._M_i +
              (context->numCommandsUpToDate).super___atomic_base<unsigned_int>._M_i;
      goto LAB_0012687d;
    case 'u':
      iVar7 = (context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i +
              (context->numCommandsCompleted).super___atomic_base<unsigned_int>._M_i;
      iVar6 = (context->numCommandsUpdated).super___atomic_base<unsigned_int>._M_i +
              (context->numCommandsUpToDate).super___atomic_base<unsigned_int>._M_i +
              context->numOutputDescriptions;
LAB_0012687d:
      __val = iVar7 - iVar6;
      break;
    default:
      if (uVar2 == '%') {
        psStack_b0 = (string *)0x25;
        goto LAB_00126781;
      }
      goto switchD_00126660_caseD_64;
    }
    psStack_b0 = (string *)buf;
    std::__cxx11::to_string(psStack_b0,__val);
    std::__cxx11::string::append((string *)&local_50);
    std::__cxx11::string::_M_dispose();
LAB_00126927:
    puVar9 = puVar10 + 1;
  } while( true );
switchD_00126660_caseD_64:
  std::__cxx11::string::push_back(cVar8);
  psStack_b0 = (string *)(ulong)(uint)(int)(char)uVar2;
LAB_00126781:
  std::__cxx11::string::push_back(cVar8);
  goto LAB_00126927;
}

Assistant:

static void writeDescription(BuildContext& context,
                                 ninja::Command* command) {
      const std::string& description =
        context.verbose ? command->getCommandString() :
        command->getEffectiveDescription();
      ++context.numOutputDescriptions;
      context.emitStatus("%s%s",
        context.statusLinePrefix(context.statusLinePrefixFormat).c_str(),
        description.c_str());

      // Whenever we write a description for a console job, make sure to finish
      // the output under the expectation that the console job might write to
      // the output. We don't make any attempt to lock this in case the console
      // job can run concurrently with anything else.
      if (command->getExecutionPool() == context.manifest->getConsolePool()) {
        context.statusOutput.finishLine();
      }
    }